

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jumptable.cc
# Opt level: O3

bool JumpBasic::isprune(Varnode *vn)

{
  PcodeOp *pPVar1;
  
  if (((vn->flags & 0x10) != 0) && (pPVar1 = vn->def, (pPVar1->flags & 0x44) == 0)) {
    return (int)((ulong)((long)(pPVar1->inrefs).
                               super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(pPVar1->inrefs).
                              super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3) == 0;
  }
  return true;
}

Assistant:

bool JumpBasic::isprune(Varnode *vn)

{
  if (!vn->isWritten()) return true;
  PcodeOp *op = vn->getDef();
  if (op->isCall()||op->isMarker()) return true;
  if (op->numInput()==0) return true;
  return false;
}